

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O1

void __thiscall
VPLGrammar::Parser::MainRuleNode::BuildProgram(MainRuleNode *this,Scope *scope,ostream *out)

{
  ASTNodeBasic *pAVar1;
  pointer puVar2;
  ulong uVar3;
  
  puVar2 = (this->super_ASTNodeBasic).children_.
           super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_ASTNodeBasic).children_.
      super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar2) {
    uVar3 = 0;
    do {
      pAVar1 = puVar2[uVar3]._M_t.
               super___uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
               ._M_t.
               super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
               .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl;
      (*pAVar1->_vptr_ASTNodeBasic[5])(pAVar1,scope,out);
      uVar3 = uVar3 + 1;
      puVar2 = (this->super_ASTNodeBasic).children_.
               super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->super_ASTNodeBasic).children_.
                                   super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3));
  }
  vpl::Scope::Finish(scope);
  return;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                for (size_t i = 0; i < children_.size(); ++i) {
                    children_[i]->BuildProgram(scope, out);
                }
                scope->Finish();
            }